

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_at_line_end(Parser *this)

{
  bool bVar1;
  csubstr r;
  
  r.str = (this->m_state->line_contents).rem.str;
  r.len = (this->m_state->line_contents).rem.len;
  bVar1 = true;
  if ((r.len != 0) && (r.str != (char *)0x0)) {
    bVar1 = basic_substring<const_char>::begins_with(&r,' ',r.len);
  }
  return bVar1;
}

Assistant:

inline bool _at_line_end() const
    {
        csubstr r = m_state->line_contents.rem;
        return r.empty() || r.begins_with(' ', r.len);
    }